

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

Promise<void> __thiscall
kj::Promise<void>::attach<capnp::LocalClient::BlockingScope>
          (Promise<void> *this,BlockingScope *attachments)

{
  PromiseBase PVar1;
  undefined8 *in_RDX;
  BlockingScope local_28;
  PromiseBase local_20;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_18;
  
  local_28.client.ptr = (Maybe<capnp::LocalClient_&>)*in_RDX;
  *in_RDX = 0;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::AttachmentPromiseNode<capnp::LocalClient::BlockingScope>,kj::_::PromiseDisposer,capnp::LocalClient::BlockingScope>
            ((PromiseDisposer *)&local_20,(OwnPromiseNode *)attachments,&local_28);
  PVar1.node.ptr = local_20.node.ptr;
  local_20.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
  (this->super_PromiseBase).node.ptr = (PromiseNode *)PVar1.node.ptr;
  local_18.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_18);
  Own<kj::_::AttachmentPromiseNode<capnp::LocalClient::BlockingScope>,_kj::_::PromiseDisposer>::
  dispose((Own<kj::_::AttachmentPromiseNode<capnp::LocalClient::BlockingScope>,_kj::_::PromiseDisposer>
           *)&local_20);
  capnp::LocalClient::BlockingScope::~BlockingScope(&local_28);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false,
      _::PromiseDisposer::appendPromise<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
          kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}